

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createSConvertTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  SpvAsmComputeShaderCase *this;
  pointer convertCase;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  testCases;
  string instruction;
  string local_118;
  ComputeShaderSpec local_f8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&instruction,"OpSConvert",(allocator<char> *)&local_f8);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"sconvert","OpSConvert");
  testCases.
  super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testCases.
  super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  testCases.
  super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  createSConvertCases(&testCases);
  for (convertCase = testCases.
                     super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr,
      convertCase !=
      testCases.
      super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
      ._M_impl.super__Vector_impl_data._M_finish; convertCase = convertCase + 1) {
    ComputeShaderSpec::ComputeShaderSpec(&local_f8);
    getConvertCaseShaderStr(&local_118,&instruction,convertCase);
    std::__cxx11::string::_M_assign((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back(&local_f8.inputs,&convertCase->m_inputBuffer);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back(&local_f8.outputs,&convertCase->m_outputBuffer);
    pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    local_f8.numWorkGroups.m_data[0] = 1;
    local_f8.numWorkGroups.m_data[1] = 1;
    local_f8.numWorkGroups.m_data[2] = 1;
    this = (SpvAsmComputeShaderCase *)operator_new(0x140);
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this,testCtx,(convertCase->m_name)._M_dataplus._M_p,
               "Convert integers with OpSConvert.",&local_f8,convertCase->m_features);
    tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)this);
    ComputeShaderSpec::~ComputeShaderSpec(&local_f8);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  ~vector(&testCases);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  std::__cxx11::string::~string((string *)&instruction);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createSConvertTests (tcu::TestContext& testCtx)
{
	const string instruction				("OpSConvert");
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, "sconvert", "OpSConvert"));
	vector<ConvertCase>				testCases;
	createSConvertCases(testCases);

	for (vector<ConvertCase>::const_iterator test = testCases.begin(); test != testCases.end(); ++test)
	{
		ComputeShaderSpec	spec;

		spec.assembly = getConvertCaseShaderStr(instruction, *test);
		spec.inputs.push_back(test->m_inputBuffer);
		spec.outputs.push_back(test->m_outputBuffer);
		spec.numWorkGroups = IVec3(1, 1, 1);

		group->addChild(new SpvAsmComputeShaderCase(testCtx, test->m_name.c_str(), "Convert integers with OpSConvert.", spec, test->m_features));
	}

	return group.release();
}